

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::DtlsSession::Init
          (Error *__return_storage_ptr__,DtlsSession *this,DtlsConfig *aConfig)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  reference ciphersuites;
  element_type *p_bio;
  uchar *pw;
  code *in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  Error local_620;
  anon_class_1_0_00000001 local_5f2;
  v10 local_5f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  char *local_5e8;
  string local_5e0;
  Error local_5c0;
  int local_594;
  undefined1 local_590 [4];
  int fail_8;
  int local_564;
  undefined1 local_560 [4];
  int fail_7;
  int local_534;
  undefined1 local_530 [4];
  int fail_6;
  int local_508;
  value_type_conflict2 local_504;
  int fail_5;
  int local_4d8;
  value_type_conflict2 local_4d4;
  int fail_4;
  anon_class_1_0_00000001 local_4a2;
  v10 local_4a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a0;
  char *local_498;
  string local_490;
  Error local_470;
  int local_444;
  undefined1 local_440 [4];
  int fail_3;
  anon_class_1_0_00000001 local_412;
  v10 local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  char *local_408;
  string local_400;
  Error local_3e0;
  int local_3b4;
  undefined1 local_3b0 [4];
  int fail_2;
  anon_class_1_0_00000001 local_382;
  v10 local_381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  char *local_378;
  string local_370;
  Error local_350;
  int local_328;
  value_type_conflict2 local_324;
  int fail_1;
  int local_2e8;
  undefined1 local_2e1;
  int fail;
  DtlsConfig *aConfig_local;
  DtlsSession *this_local;
  Error *error;
  undefined1 local_2b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  char *local_2a0;
  string *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  char *pcStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_278 [2];
  undefined1 local_268 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  char *local_250;
  string *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  char *pcStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228 [2];
  undefined1 local_218 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  char *local_200;
  string *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  char *pcStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [3];
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  char *local_1a8;
  string *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  char *pcStack_190;
  string *local_188;
  v10 *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_178;
  v10 *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_168;
  v10 *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_158;
  v10 *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *pcStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  char *pcStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  char *pcStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  char *pcStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  Error **local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  Error **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  local_2e1 = 0;
  _fail = aConfig;
  aConfig_local = (DtlsConfig *)this;
  this_local = (DtlsSession *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  local_2e8 = mbedtls_ssl_config_defaults(&this->mConfig,this->mIsServer & 1,1,0);
  if (local_2e8 != 0) {
    ErrorFromMbedtlsError((Error *)&fail_1,local_2e8);
    Error::operator=(__return_storage_ptr__,(Error *)&fail_1);
    Error::~Error((Error *)&fail_1);
    return __return_storage_ptr__;
  }
  mbedtls_ssl_conf_authmode(&this->mConfig,2);
  mbedtls_debug_set_threshold(10);
  if ((_fail->mEnableDebugLogging & 1U) != 0) {
    mbedtls_ssl_conf_dbg(&this->mConfig,HandleMbedtlsDebug,(void *)0x0);
  }
  mbedtls_ssl_conf_handshake_timeout(&this->mConfig,8000,60000);
  std::vector<int,_std::allocator<int>_>::clear(&this->mCipherSuites);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&_fail->mPSK);
  if (!bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mPSK,&_fail->mPSK);
    local_324 = 0xc0ff;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mCipherSuites,&local_324);
  }
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&_fail->mCaChain);
  if (((!bVar1) ||
      (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&_fail->mOwnCert),
      !bVar1)) ||
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&_fail->mOwnKey),
     !bVar1)) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&_fail->mCaChain,0);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&_fail->mCaChain);
    local_328 = mbedtls_x509_crt_parse(&this->mCaChain,pvVar2,sVar3);
    if (local_328 != 0) {
      Init::anon_class_1_0_00000001::operator()(&local_382);
      local_178 = &local_380;
      local_180 = &local_381;
      bVar4 = ::fmt::v10::operator()(local_180);
      local_378 = (char *)bVar4.size_;
      local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      ErrorFromMbedtlsError((Error *)local_3b0,local_328);
      local_1a0 = Error::GetMessage_abi_cxx11_((Error *)local_3b0);
      local_188 = &local_370;
      local_198 = local_380;
      pcStack_190 = local_378;
      local_140 = &local_198;
      local_1b0 = local_380;
      local_1a8 = local_378;
      local_138 = local_1b0;
      pcStack_130 = local_1a8;
      local_1d8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_1a0,(v10 *)local_188,local_380);
      local_c0 = local_1c0;
      local_c8 = local_1d8;
      local_b0 = 0xd;
      args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                        )in_R9;
      args.desc_ = (unsigned_long_long)local_c8;
      fmt.size_ = 0xd;
      fmt.data_ = local_1a8;
      local_b8 = local_c8;
      local_a8 = local_c0;
      local_10 = local_c8;
      ::fmt::v10::vformat_abi_cxx11_(&local_370,(v10 *)local_1b0,fmt,args);
      Error::Error(&local_350,kInvalidArgs,&local_370);
      Error::operator=(__return_storage_ptr__,&local_350);
      Error::~Error(&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      Error::~Error((Error *)local_3b0);
      return __return_storage_ptr__;
    }
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&_fail->mOwnCert,0);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&_fail->mOwnCert);
    local_3b4 = mbedtls_x509_crt_parse(&this->mOwnCert,pvVar2,sVar3);
    if (local_3b4 != 0) {
      Init::anon_class_1_0_00000001::operator()(&local_412);
      local_168 = &local_410;
      local_170 = &local_411;
      bVar4 = ::fmt::v10::operator()(local_170);
      local_408 = (char *)bVar4.size_;
      local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      ErrorFromMbedtlsError((Error *)local_440,local_3b4);
      local_1f8 = Error::GetMessage_abi_cxx11_((Error *)local_440);
      local_1e0 = &local_400;
      local_1f0 = local_410;
      pcStack_1e8 = local_408;
      local_120 = &local_1f0;
      local_208 = local_410;
      local_200 = local_408;
      local_118 = local_208;
      pcStack_110 = local_200;
      local_228[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_1f8,(v10 *)local_1e0,local_410);
      local_98 = local_218;
      local_a0 = local_228;
      local_88 = 0xd;
      args_00.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )in_R9;
      args_00.desc_ = (unsigned_long_long)local_a0;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = local_200;
      local_90 = local_a0;
      local_80 = local_98;
      local_18 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_400,(v10 *)local_208,fmt_00,args_00);
      Error::Error(&local_3e0,kInvalidArgs,&local_400);
      Error::operator=(__return_storage_ptr__,&local_3e0);
      Error::~Error(&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      Error::~Error((Error *)local_440);
      return __return_storage_ptr__;
    }
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&_fail->mOwnKey,0);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&_fail->mOwnKey);
    in_R9 = mbedtls_ctr_drbg_random;
    local_444 = mbedtls_pk_parse_key
                          (&this->mOwnKey,pvVar2,sVar3,(uchar *)0x0,0,mbedtls_ctr_drbg_random,
                           &this->mCtrDrbg);
    if (local_444 != 0) {
      Init::anon_class_1_0_00000001::operator()(&local_4a2);
      local_158 = &local_4a0;
      local_160 = &local_4a1;
      bVar4 = ::fmt::v10::operator()(local_160);
      local_498 = (char *)bVar4.size_;
      local_4a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      ErrorFromMbedtlsError((Error *)&fail_4,local_444);
      local_248 = Error::GetMessage_abi_cxx11_((Error *)&fail_4);
      local_230 = &local_490;
      local_240 = local_4a0;
      pcStack_238 = local_498;
      local_100 = &local_240;
      local_258 = local_4a0;
      local_250 = local_498;
      local_f8 = local_258;
      pcStack_f0 = local_250;
      local_278[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_248,(v10 *)local_230,local_4a0);
      local_70 = local_268;
      local_78 = local_278;
      local_60 = 0xd;
      args_01.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )in_R9;
      args_01.desc_ = (unsigned_long_long)local_78;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = local_250;
      local_68 = local_78;
      local_58 = local_70;
      local_20 = local_78;
      ::fmt::v10::vformat_abi_cxx11_(&local_490,(v10 *)local_258,fmt_01,args_01);
      Error::Error(&local_470,kInvalidArgs,&local_490);
      Error::operator=(__return_storage_ptr__,&local_470);
      Error::~Error(&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      Error::~Error((Error *)&fail_4);
      return __return_storage_ptr__;
    }
    local_4d4 = 0xc0ae;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mCipherSuites,&local_4d4);
    mbedtls_ssl_conf_ca_chain(&this->mConfig,&this->mCaChain,(mbedtls_x509_crl *)0x0);
    local_4d8 = mbedtls_ssl_conf_own_cert(&this->mConfig,&this->mOwnCert,&this->mOwnKey);
    if (local_4d8 != 0) {
      ErrorFromMbedtlsError((Error *)&fail_5,local_4d8);
      Error::operator=(__return_storage_ptr__,(Error *)&fail_5);
      Error::~Error((Error *)&fail_5);
      return __return_storage_ptr__;
    }
    local_4d8 = 0;
  }
  local_504 = 0;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mCipherSuites,&local_504);
  ciphersuites = std::vector<int,_std::allocator<int>_>::operator[](&this->mCipherSuites,0);
  mbedtls_ssl_conf_ciphersuites(&this->mConfig,ciphersuites);
  mbedtls_ssl_set_export_keys_cb(&this->mSsl,HandleMbedtlsExportKeys,this);
  mbedtls_ssl_conf_rng(&this->mConfig,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
  if ((this->mIsServer & 1U) != 0) {
    local_508 = mbedtls_ssl_cookie_setup(&this->mCookie,mbedtls_ctr_drbg_random,&this->mCtrDrbg);
    if (local_508 != 0) {
      ErrorFromMbedtlsError((Error *)local_530,local_508);
      Error::operator=(__return_storage_ptr__,(Error *)local_530);
      Error::~Error((Error *)local_530);
      return __return_storage_ptr__;
    }
    mbedtls_ssl_conf_dtls_cookies
              (&this->mConfig,mbedtls_ssl_cookie_write,mbedtls_ssl_cookie_check,&this->mCookie);
  }
  p_bio = std::__shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>::get
                    (&(this->mSocket).
                      super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>);
  mbedtls_ssl_set_bio(&this->mSsl,p_bio,Socket::Send,Socket::Receive,
                      (mbedtls_ssl_recv_timeout_t *)0x0);
  mbedtls_ssl_set_timer_cb
            (&this->mSsl,&this->mHandshakeTimer,DtlsTimer::SetDelay,DtlsTimer::GetDelay);
  local_534 = mbedtls_ssl_conf_max_frag_len(&this->mConfig,'\x02');
  if (local_534 == 0) {
    mbedtls_ssl_set_mtu(&this->mSsl,0x500);
    local_564 = mbedtls_ssl_setup(&this->mSsl,&this->mConfig);
    if (local_564 == 0) {
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&_fail->mPSK);
      if (!bVar1) {
        pw = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&_fail->mPSK);
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&_fail->mPSK);
        local_594 = mbedtls_ssl_set_hs_ecjpake_password(&this->mSsl,pw,sVar3);
        if (local_594 != 0) {
          Init::anon_class_1_0_00000001::operator()(&local_5f2);
          local_148 = &local_5f0;
          local_150 = &local_5f1;
          bVar4 = ::fmt::v10::operator()(local_150);
          local_5e8 = (char *)bVar4.size_;
          local_5f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      bVar4.data_;
          ::fmt::v10::detail::
          check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          ErrorFromMbedtlsError(&local_620,local_594);
          local_298 = Error::GetMessage_abi_cxx11_(&local_620);
          local_280 = &local_5e0;
          local_290 = local_5f0;
          pcStack_288 = local_5e8;
          local_e0 = &local_290;
          local_2a8 = local_5f0;
          local_2a0 = local_5e8;
          local_d8 = local_2a8;
          pcStack_d0 = local_2a0;
          error = (Error *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_298,(v10 *)local_280,local_5f0);
          local_48 = local_2b8;
          local_50 = &error;
          local_38 = 0xd;
          args_02.field_1 =
               (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )in_R9;
          args_02.desc_ = (unsigned_long_long)local_50;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = local_2a0;
          local_40 = local_50;
          local_30 = local_48;
          local_28 = local_50;
          ::fmt::v10::vformat_abi_cxx11_(&local_5e0,(v10 *)local_2a8,fmt_02,args_02);
          Error::Error(&local_5c0,kSecurity,&local_5e0);
          Error::operator=(__return_storage_ptr__,&local_5c0);
          Error::~Error(&local_5c0);
          std::__cxx11::string::~string((string *)&local_5e0);
          Error::~Error(&local_620);
        }
      }
    }
    else {
      ErrorFromMbedtlsError((Error *)local_590,local_564);
      Error::operator=(__return_storage_ptr__,(Error *)local_590);
      Error::~Error((Error *)local_590);
    }
  }
  else {
    ErrorFromMbedtlsError((Error *)local_560,local_534);
    Error::operator=(__return_storage_ptr__,(Error *)local_560);
    Error::~Error((Error *)local_560);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Init(const DtlsConfig &aConfig)
{
    Error error;

    if (int fail = mbedtls_ssl_config_defaults(&mConfig, mIsServer, MBEDTLS_SSL_TRANSPORT_DATAGRAM,
                                               MBEDTLS_SSL_PRESET_DEFAULT))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    mbedtls_ssl_conf_authmode(&mConfig, kAuthMode);

    // Debug
    mbedtls_debug_set_threshold(10);

    if (aConfig.mEnableDebugLogging)
    {
        mbedtls_ssl_conf_dbg(&mConfig, HandleMbedtlsDebug, nullptr);
    }

    // Timeouts
    mbedtls_ssl_conf_handshake_timeout(&mConfig, kDtlsHandshakeTimeoutMin * 1000, kDtlsHandshakeTimeoutMax * 1000);

    mCipherSuites.clear();

    // PSK
    if (!aConfig.mPSK.empty())
    {
        mPSK = aConfig.mPSK;
        mCipherSuites.push_back(MBEDTLS_TLS_ECJPAKE_WITH_AES_128_CCM_8);
    }

    // X509
    if (!aConfig.mCaChain.empty() || !aConfig.mOwnCert.empty() || !aConfig.mOwnKey.empty())
    {
        if (int fail = mbedtls_x509_crt_parse(&mCaChain, &aConfig.mCaChain[0], aConfig.mCaChain.size()))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad CA certificate; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
        if (int fail = mbedtls_x509_crt_parse(&mOwnCert, &aConfig.mOwnCert[0], aConfig.mOwnCert.size()))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad certificate; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
        if (int fail = mbedtls_pk_parse_key(&mOwnKey, &aConfig.mOwnKey[0], aConfig.mOwnKey.size(), nullptr, 0,
                                            mbedtls_ctr_drbg_random, &mCtrDrbg))
        {
            ExitNow(error = ERROR_INVALID_ARGS("bad private key; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }

        mCipherSuites.push_back(MBEDTLS_TLS_ECDHE_ECDSA_WITH_AES_128_CCM_8);

        mbedtls_ssl_conf_ca_chain(&mConfig, &mCaChain, nullptr);
        if (int fail = mbedtls_ssl_conf_own_cert(&mConfig, &mOwnCert, &mOwnKey))
        {
            ExitNow(error = ErrorFromMbedtlsError(fail));
        }
    }

    mCipherSuites.push_back(0);
    mbedtls_ssl_conf_ciphersuites(&mConfig, &mCipherSuites[0]);

    mbedtls_ssl_set_export_keys_cb(&mSsl, HandleMbedtlsExportKeys, this);
    mbedtls_ssl_conf_rng(&mConfig, mbedtls_ctr_drbg_random, &mCtrDrbg);

    // Cookie
    if (mIsServer)
    {
        if (int fail = mbedtls_ssl_cookie_setup(&mCookie, mbedtls_ctr_drbg_random, &mCtrDrbg))
        {
            ExitNow(error = ErrorFromMbedtlsError(fail));
        }
        mbedtls_ssl_conf_dtls_cookies(&mConfig, mbedtls_ssl_cookie_write, mbedtls_ssl_cookie_check, &mCookie);
    }

    // bio
    // mbedtls_ssl_set_bio(&mSsl, &mNetCtx, mbedtls_net_send, mbedtls_net_recv, nullptr);
    mbedtls_ssl_set_bio(&mSsl, mSocket.get(), Socket::Send, Socket::Receive, nullptr);

    // Timer
    mbedtls_ssl_set_timer_cb(&mSsl, &mHandshakeTimer, DtlsTimer::SetDelay, DtlsTimer::GetDelay);

    if (int fail = mbedtls_ssl_conf_max_frag_len(&mConfig, KMaxFragmentLengthCode))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // MTU
    mbedtls_ssl_set_mtu(&mSsl, kMaxTransmissionUnit);

    // Setup
    if (int fail = mbedtls_ssl_setup(&mSsl, &mConfig))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // Set EC-JPAKE password after initializing the SSL object.
    if (!aConfig.mPSK.empty())
    {
        if (int fail = mbedtls_ssl_set_hs_ecjpake_password(&mSsl, aConfig.mPSK.data(), aConfig.mPSK.size()))
        {
            ExitNow(error =
                        ERROR_SECURITY("set DTLS pre-shared key failed; {}", ErrorFromMbedtlsError(fail).GetMessage()));
        }
    }

exit:
    return error;
}